

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char> __thiscall
fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,basic_string_view<char> s,
          basic_format_specs<char> *specs)

{
  byte bVar1;
  char *pcVar2;
  buffer_appender<char> bVar3;
  uint *puVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  char *data;
  size_t size;
  char *pcVar9;
  
  puVar4 = (uint *)s.size_;
  pcVar6 = s.data_;
  pcVar2 = (char *)(long)(int)puVar4[1];
  pcVar9 = pcVar6;
  if (pcVar2 < pcVar6) {
    pcVar9 = pcVar2;
  }
  if ((long)pcVar2 < 0) {
    pcVar9 = pcVar6;
  }
  uVar8 = (ulong)*puVar4;
  uVar5 = 0;
  if (uVar8 != 0) {
    if (pcVar9 != (char *)0x0) {
      pcVar2 = (char *)0x0;
      do {
        uVar5 = uVar5 + 1;
        pcVar2 = pcVar2 + 1;
      } while (pcVar9 != pcVar2);
    }
    if ((int)*puVar4 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/core.h"
                  ,0x13c,"negative value");
    }
  }
  uVar7 = 0;
  if (uVar5 <= uVar8) {
    uVar7 = uVar8 - uVar5;
  }
  bVar1 = *(byte *)((long)&basic_data<void>::left_padding_shifts +
                   (ulong)(*(byte *)((long)puVar4 + 9) & 0xf));
  if (*(char **)(this + 0x18) <
      pcVar9 + *(byte *)((long)puVar4 + 0xe) * uVar7 + *(long *)(this + 0x10)) {
    (*(code *)**(undefined8 **)this)();
  }
  uVar8 = uVar7 >> (bVar1 & 0x3f);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)this,uVar8,(fill_t<char> *)((long)puVar4 + 10));
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                    ((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container,
                     pcVar9 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container,bVar3);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    (bVar3,uVar7 - uVar8,(fill_t<char> *)((long)puVar4 + 10));
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}